

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O3

QPDFObjectHandle __thiscall QPDFParser::parseRemainder(QPDFParser *this,bool content_stream)

{
  _Rb_tree_header *p_Var1;
  token_type_e tVar2;
  Tokenizer *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pQVar5;
  pointer pQVar6;
  pointer pSVar7;
  pointer pcVar8;
  _Alloc_hider _Var9;
  size_type sVar10;
  bool bVar11;
  int iVar12;
  _Rb_tree_color _Var13;
  qpdf_offset_t qVar14;
  longlong lVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  mapped_type *pmVar17;
  StackFrame *pSVar18;
  const_iterator cVar19;
  undefined8 uVar20;
  string *psVar21;
  logic_error *this_00;
  int iVar22;
  QPDFObject *__tmp;
  long i;
  _Base_ptr p_Var23;
  undefined4 in_EDX;
  QPDFParser *extraout_RDX;
  QPDFParser *extraout_RDX_00;
  QPDFParser *extraout_RDX_01;
  QPDFParser *extraout_RDX_02;
  QPDFParser *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var24;
  QPDFParser *extraout_RDX_04;
  QPDFParser *extraout_RDX_05;
  long lVar25;
  _func_int **pp_Var26;
  undefined7 in_register_00000031;
  QPDFParser *this_01;
  StackFrame *pSVar27;
  size_t *psVar28;
  _Base_ptr p_Var29;
  _Atomic_word *p_Var30;
  QPDFObjectHandle QVar31;
  string s;
  undefined1 local_130 [8];
  undefined1 local_128 [24];
  _Base_ptr local_110;
  size_t local_108;
  QPDFParser *local_100;
  uint local_f4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *local_f0;
  key_type local_e8;
  undefined4 local_c4;
  vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>> *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_b8;
  key_type local_b0;
  key_type local_90;
  key_type local_70;
  string local_50;
  
  this_01 = (QPDFParser *)CONCAT71(in_register_00000031,content_stream);
  this_01->bad_count = 0;
  local_c0 = (vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>> *)
             &this_01->stack;
  local_b8 = &(this_01->description).
              super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
  local_100 = this;
  local_c4 = in_EDX;
LAB_001dd388:
  local_f4 = 0;
LAB_001dd390:
  pp_Var26 = (_func_int **)(local_128 + 8);
  bVar11 = ::qpdf::Tokenizer::nextToken
                     (this_01->tokenizer,this_01->input,this_01->object_description,0);
  if (!bVar11) {
    pTVar3 = this_01->tokenizer;
    qVar14 = InputSource::getLastOffset(this_01->input);
    warn(this_01,qVar14,&pTVar3->error_message);
  }
  this_01->good_count = this_01->good_count + 1;
  iVar12 = this_01->int_count;
  if (iVar12 != 0) {
    tVar2 = this_01->tokenizer->type;
    if (tVar2 == tt_integer) goto code_r0x001dd3e7;
    if (tVar2 == tt_word && 1 < iVar12) {
      iVar12 = std::__cxx11::string::compare((char *)&this_01->tokenizer->raw_val);
      if (iVar12 == 0) {
        if (this_01->context == (QPDF *)0x0) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    (this_00,
                     "QPDFParser::parse called without context on an object with indirect references"
                    );
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        iVar12 = this_01->int_count;
        iVar22 = (iVar12 - ((iVar12 - (iVar12 + -1 >> 0x1f)) - 1U & 0xfffffffe)) + -1;
        lVar25 = this_01->int_buffer[iVar22];
        if (lVar25 - 0x80000000U < 0xffffffff00000000) {
          QIntC::IntConverter<long_long,_int,_true,_true>::error(lVar25);
          lVar25 = this_01->int_buffer[iVar22];
          iVar12 = this_01->int_count;
        }
        i = this_01->int_buffer[iVar12 % 2];
        if (i - 0x80000000U < 0xffffffff00000000) {
          QIntC::IntConverter<long_long,_int,_true,_true>::error(i);
          i = this_01->int_buffer[iVar12 % 2];
        }
        if (((int)lVar25 < 1) || (0xfffe < (uint)i)) {
          addNull(this_01);
        }
        else {
          QPDF::getObjectForParser((QPDF *)local_130,(int)this_01->context,(int)lVar25,SUB81(i,0));
          add(this_01,(shared_ptr<QPDFObject> *)local_130);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._0_8_);
          }
        }
        this_01->int_count = 0;
        goto LAB_001dd390;
      }
      iVar12 = this_01->int_count;
    }
    if (0 < iVar12) {
      iVar22 = 1;
      if (iVar12 != 1) {
        addInt(this_01,iVar12 + -1);
        iVar22 = this_01->int_count;
      }
      addInt(this_01,iVar22);
      this_01->int_count = 0;
    }
  }
  pTVar3 = this_01->tokenizer;
  switch(pTVar3->type) {
  case tt_bad:
    goto switchD_001dd4e6_caseD_0;
  case tt_array_close:
    if (this_01->bad_count == 0) {
      if (this_01->sanity_checks == true) {
        iVar12 = this_01->max_bad_count;
        goto joined_r0x001ddb37;
      }
    }
    else {
      iVar12 = this_01->max_bad_count;
joined_r0x001ddb37:
      if (iVar12 == 0) goto LAB_001de273;
    }
    pSVar27 = this_01->frame;
    if (pSVar27->state != st_array) {
      local_130 = (undefined1  [8])pp_Var26;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,"treating unexpected array close token as null","");
      qVar14 = InputSource::getLastOffset(this_01->input);
      warn(this_01,qVar14,(string *)local_130);
      goto LAB_001ddc29;
    }
    if (pSVar27->null_count < 0x65) {
      local_130 = (undefined1  [8])0x0;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (pSVar27->olist).
               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
               super__Vector_impl_data._M_start;
      pQVar5 = (pSVar27->olist).
               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pQVar6 = (pSVar27->olist).
               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (pSVar27->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pSVar27->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar27->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128._0_8_ = p_Var4;
      local_128._8_8_ = pQVar5;
      local_128._16_8_ = pQVar6;
      local_e8._M_string_length = (size_type)operator_new(0x70);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length)->_M_weak_count = 1
      ;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eaaf0;
      local_e8._M_dataplus._M_p = (pointer)(local_e8._M_string_length + 0x10);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      local_130 = (undefined1  [8])0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x10))->
        _M_use_count = p_Var4;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x20))->
      _vptr__Sp_counted_base = (_func_int **)pQVar5;
      *(pointer *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x20))->
        _M_use_count = pQVar6;
      local_128._16_8_ = (_Base_ptr)0x0;
      local_128._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128._8_8_ = (_Base_ptr)0x0;
      *(undefined1 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x40))->
        _vptr__Sp_counted_base = 8;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x40))->
      _M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x40))->
      _M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x50))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x50))->
      _M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x50))->
      _M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x60))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x60))->
      _M_use_count = -1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x60))->
      _M_weak_count = -1;
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_128);
      std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
                ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)
                 local_130);
      _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    }
    else {
      QPDF_Array::QPDF_Array((QPDF_Array *)local_130,&pSVar27->olist,true);
      local_e8._M_string_length = (size_type)operator_new(0x70);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length)->_M_weak_count = 1
      ;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eaaf0;
      local_e8._M_dataplus._M_p = (pointer)(local_e8._M_string_length + 0x10);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)local_130;
      local_130 = (undefined1  [8])0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x10))->
      _M_use_count = local_128._0_4_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x10))->
      _M_weak_count = local_128._4_4_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x20))->
      _vptr__Sp_counted_base = (_func_int **)local_128._8_8_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x20))->
      _M_use_count = local_128._16_4_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x20))->
      _M_weak_count = local_128._20_4_;
      local_128._16_8_ = (_Base_ptr)0x0;
      local_128._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128._8_8_ = (_Base_ptr)0x0;
      *(undefined1 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x40))->
        _vptr__Sp_counted_base = 8;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x40))->
      _M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x40))->
      _M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x50))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x50))->
      _M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x50))->
      _M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x60))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x60))->
      _M_use_count = -1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x60))->
      _M_weak_count = -1;
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_128);
      std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
                ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)
                 local_130);
      _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    }
    _Var9._M_p = local_e8._M_dataplus._M_p;
    if ((element_type *)local_e8._M_dataplus._M_p != (element_type *)0x0) {
      lVar25 = this_01->frame->offset;
      *(QPDF **)(local_e8._M_dataplus._M_p + 0x48) = this_01->context;
      (((shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
         *)(local_e8._M_dataplus._M_p + 0x38))->
      super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (this_01->description).
                 super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_dataplus._M_p + 0x40),
                 local_b8);
      _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
      if (*(long *)(_Var9._M_p + 0x58) < 0) {
        *(long *)(_Var9._M_p + 0x58) = lVar25 + -1;
      }
    }
    pSVar7 = (this_01->stack).
             super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pSVar7 -
                 (long)(this_01->stack).
                       super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3) < 2) {
LAB_001de30e:
      goto LAB_001de313;
    }
    pSVar27 = pSVar7 + -1;
    (this_01->stack).
    super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar27;
    __gnu_cxx::new_allocator<QPDFParser::StackFrame>::destroy<QPDFParser::StackFrame>
              ((new_allocator<QPDFParser::StackFrame> *)local_c0,pSVar27);
    this_01->frame =
         (this_01->stack).
         super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>._M_impl
         .super__Vector_impl_data._M_finish + -1;
    add(this_01,(shared_ptr<QPDFObject> *)&local_e8);
    break;
  case tt_array_open:
  case tt_dict_open:
    goto switchD_001dd4e6_caseD_2;
  case tt_brace_close:
  case tt_brace_open:
    local_130 = (undefined1  [8])pp_Var26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"treating unexpected brace token as null","");
    qVar14 = InputSource::getLastOffset(this_01->input);
    warn(this_01,qVar14,(string *)local_130);
    goto LAB_001ddc29;
  case tt_dict_close:
    if (((this_01->bad_count != 0) || (this_01->sanity_checks == true)) &&
       (this_01->max_bad_count == 0)) {
LAB_001de273:
      tooManyBadTokens(this_01);
      goto LAB_001de36a;
    }
    pSVar27 = this_01->frame;
    if (1 < (int)pSVar27->state) {
      local_130 = (undefined1  [8])(local_128 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,"unexpected dictionary close token","");
      qVar14 = InputSource::getLastOffset(this_01->input);
      warn(this_01,qVar14,(string *)local_130);
      goto LAB_001ddc29;
    }
    local_f0 = &pSVar27->dict;
    if (pSVar27->state == st_dictionary_value) {
      qVar14 = pSVar27->offset;
      local_130 = (undefined1  [8])(local_128 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,
                 "dictionary ended prematurely; using null as value for last key","");
      warn(this_01,qVar14,(string *)local_130);
      if (local_130 != (undefined1  [8])(local_128 + 8)) {
        operator_delete((void *)local_130,(ulong)(local_128._8_8_ + 1));
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      p_Var16->_M_use_count = 1;
      p_Var16->_M_weak_count = 1;
      p_Var16->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eaaf0;
      *(undefined1 *)&p_Var16[4]._vptr__Sp_counted_base = 2;
      p_Var16[4]._M_use_count = 0;
      p_Var16[4]._M_weak_count = 0;
      p_Var16[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var16[5]._M_use_count = 0;
      p_Var16[5]._M_weak_count = 0;
      p_Var16[6]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var16[6]._M_use_count = -1;
      p_Var16[6]._M_weak_count = -1;
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                ::operator[](local_f0,&this_01->frame->key);
      (pmVar17->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var16 + 1);
      p_Var4 = (pmVar17->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pmVar17->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var16;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
    }
    pSVar18 = this_01->frame;
    if ((pSVar18->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pSVar18->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      fixMissingKeys(this_01);
      pSVar18 = this_01->frame;
    }
    if ((pSVar18->contents_string)._M_string_length != 0) {
      local_130 = (undefined1  [8])(local_128 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"/Type","");
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               ::find(&local_f0->_M_t,(key_type *)local_130);
      p_Var1 = &(pSVar27->dict)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
        bVar11 = false;
      }
      else {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"/Type","");
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  ::operator[](local_f0,&local_e8);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/Sig","");
        bVar11 = QPDFObjectHandle::isNameAndEquals(pmVar17,&local_50);
        if (bVar11) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/ByteRange","");
          cVar19 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                   ::find(&local_f0->_M_t,&local_70);
          if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
            bVar11 = false;
          }
          else {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/Contents","");
            cVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                     ::find(&local_f0->_M_t,&local_90);
            if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
              bVar11 = false;
            }
            else {
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/Contents","");
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                        ::operator[](local_f0,&local_b0);
              bVar11 = QPDFObjectHandle::isString(pmVar17);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar11 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_130 != (undefined1  [8])(local_128 + 8)) {
        operator_delete((void *)local_130,(ulong)(local_128._8_8_ + 1));
      }
      if (bVar11 != false) {
        QPDFObjectHandle::newString((QPDFObjectHandle *)&local_e8,&this_01->frame->contents_string);
        local_130 = (undefined1  [8])(local_128 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"/Contents","");
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  ::operator[](local_f0,(key_type *)local_130);
        sVar10 = local_e8._M_string_length;
        _Var9._M_p = local_e8._M_dataplus._M_p;
        local_e8._M_dataplus._M_p = (pointer)0x0;
        local_e8._M_string_length = 0;
        p_Var4 = (pmVar17->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (pmVar17->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)_Var9._M_p;
        (pmVar17->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar10;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        if (local_130 != (undefined1  [8])(local_128 + 8)) {
          operator_delete((void *)local_130,(ulong)(local_128._8_8_ + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
        }
        local_130 = (undefined1  [8])(local_128 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"/Contents","");
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  ::operator[](local_f0,(key_type *)local_130);
        QPDFObjectHandle::setParsedOffset(pmVar17,this_01->frame->contents_offset);
        if (local_130 != (undefined1  [8])(local_128 + 8)) {
          operator_delete((void *)local_130,(ulong)(local_128._8_8_ + 1));
        }
      }
    }
    local_128._8_8_ = (pSVar27->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr)local_128._8_8_ == (_Base_ptr)0x0) {
      local_128._8_8_ = (_Base_ptr)0x0;
      _Var13 = _S_red;
      local_128._16_8_ = local_128;
      psVar28 = &local_108;
      local_110 = (_Base_ptr)local_128._16_8_;
    }
    else {
      p_Var1 = &(pSVar27->dict)._M_t._M_impl.super__Rb_tree_header;
      _Var13 = (pSVar27->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      local_128._16_8_ = (pSVar27->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_110 = (pSVar27->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      ((_Base_ptr)local_128._8_8_)->_M_parent = (_Base_ptr)local_128;
      psVar28 = &(pSVar27->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_108 = (pSVar27->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      (pSVar27->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pSVar27->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (pSVar27->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    *psVar28 = 0;
    local_128._0_4_ = _Var13;
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = (size_type)operator_new(0x70);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eaaf0;
    p_Var23 = (_Base_ptr)
              &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x10))
               ->_M_use_count;
    if ((_Base_ptr)local_128._8_8_ == (_Base_ptr)0x0) {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x20))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var30 = &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x30)
                 )->_M_use_count;
      _Var13 = _S_red;
      p_Var29 = p_Var23;
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x20))->
      _vptr__Sp_counted_base = (_func_int **)local_128._8_8_;
      *(_Base_ptr *)(local_128._8_8_ + 8) = p_Var23;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x30))->
      _M_use_count = (undefined4)local_108;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x30))->
      _M_weak_count = local_108._4_4_;
      local_128._8_8_ = (_Base_ptr)0x0;
      p_Var30 = (_Atomic_word *)&local_108;
      p_Var23 = (_Base_ptr)local_128._16_8_;
      p_Var29 = local_110;
      _Var13 = local_128._0_4_;
      local_128._16_8_ = (_Base_ptr)local_128;
      local_110 = (_Base_ptr)local_128;
    }
    *(_Base_ptr *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x20))->
      _M_use_count = p_Var23;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)p_Var29;
    *(size_t *)p_Var30 = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x10))->
    _M_use_count = _Var13;
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x40))->
      _vptr__Sp_counted_base = 9;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x40))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x40))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x50))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x50))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x50))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x60))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x60))->
    _M_use_count = -1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_string_length + 0x60))->
    _M_weak_count = -1;
    local_e8._M_dataplus._M_p = (pointer)(local_e8._M_string_length + 0x10);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 *)local_130);
    _Var9._M_p = local_e8._M_dataplus._M_p;
    _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
    if ((element_type *)local_e8._M_dataplus._M_p != (element_type *)0x0) {
      lVar25 = this_01->frame->offset;
      *(QPDF **)(local_e8._M_dataplus._M_p + 0x48) = this_01->context;
      (((shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
         *)(local_e8._M_dataplus._M_p + 0x38))->
      super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (this_01->description).
                 super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_dataplus._M_p + 0x40),
                 local_b8);
      _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_03;
      if (*(long *)(_Var9._M_p + 0x58) < 0) {
        *(long *)(_Var9._M_p + 0x58) = lVar25 + -2;
      }
    }
    pSVar7 = (this_01->stack).
             super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pSVar7 -
                 (long)(this_01->stack).
                       super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3) < 2)
    goto LAB_001de30e;
    pSVar27 = pSVar7 + -1;
    (this_01->stack).
    super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar27;
    __gnu_cxx::new_allocator<QPDFParser::StackFrame>::destroy<QPDFParser::StackFrame>
              ((new_allocator<QPDFParser::StackFrame> *)local_c0,pSVar27);
    this_01->frame =
         (this_01->stack).
         super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>._M_impl
         .super__Vector_impl_data._M_finish + -1;
    add(this_01,(shared_ptr<QPDFObject> *)&local_e8);
    break;
  case tt_integer:
    if ((char)local_c4 == '\0') {
      qVar14 = InputSource::getLastOffset(this_01->input);
      this_01->last_offset_buffer[1] = qVar14;
      lVar15 = QUtil::string_to_ll((&this_01->tokenizer->val)
                                   [(this_01->tokenizer->type & ~tt_array_open) != tt_name].
                                   _M_dataplus._M_p);
      this_01->int_buffer[1] = lVar15;
      this_01->int_count = 1;
    }
    else {
      local_130 = (undefined1  [8])QUtil::string_to_ll((pTVar3->raw_val)._M_dataplus._M_p);
      addScalar<QPDF_Integer,long_long>(this_01,(longlong *)local_130);
    }
    goto LAB_001dd390;
  case tt_name:
    if (this_01->frame->state == st_dictionary_key) {
      std::__cxx11::string::_M_assign((string *)&this_01->frame->key);
      pSVar27 = this_01->frame;
      pSVar27->state = st_dictionary_value;
      local_f4 = 0;
      if (this_01->decrypter != (StringDecrypter *)0x0) {
        uVar20 = std::__cxx11::string::compare((char *)&pSVar27->key);
        local_f4 = (uint)CONCAT71((int7)((ulong)uVar20 >> 8),(int)uVar20 == 0);
      }
    }
    else {
      addScalar<QPDF_Name,std::__cxx11::string_const&>(this_01,&pTVar3->val);
    }
    goto LAB_001dd390;
  case tt_real:
    addScalar<QPDF_Real,std::__cxx11::string_const&>(this_01,&pTVar3->raw_val);
    goto LAB_001dd390;
  case tt_string:
    if (this_01->decrypter == (StringDecrypter *)0x0) goto LAB_001ddad7;
    if ((local_f4 & 1) != 0) {
      std::__cxx11::string::_M_assign((string *)&this_01->frame->contents_string);
      qVar14 = InputSource::getLastOffset(this_01->input);
      this_01->frame->contents_offset = qVar14;
    }
    pcVar8 = (pTVar3->val)._M_dataplus._M_p;
    local_130 = (undefined1  [8])pp_Var26;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_130,pcVar8,pcVar8 + (pTVar3->val)._M_string_length);
    (*this_01->decrypter->_vptr_StringDecrypter[2])
              (this_01->decrypter,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    addScalar<QPDF_String,std::__cxx11::string&>
              (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130);
    if (local_130 != (undefined1  [8])pp_Var26) {
      operator_delete((void *)local_130,(ulong)(local_128._8_8_ + 1));
    }
    goto LAB_001dd388;
  case tt_null:
    goto switchD_001dd4e6_caseD_b;
  case tt_bool:
    iVar12 = std::__cxx11::string::compare((char *)&pTVar3->raw_val);
    local_130[0] = iVar12 == 0;
    addScalar<QPDF_Bool,bool>(this_01,(bool *)local_130);
    goto LAB_001dd390;
  case tt_word:
    if ((char)local_c4 == '\0') {
      local_130 = (undefined1  [8])pp_Var26;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,"unknown token while reading object; treating as string","");
      qVar14 = InputSource::getLastOffset(this_01->input);
      warn(this_01,qVar14,(string *)local_130);
      if (local_130 != (undefined1  [8])pp_Var26) {
        operator_delete((void *)local_130,(ulong)(local_128._8_8_ + 1));
      }
      bVar11 = tooManyBadTokens(this_01);
      if (bVar11) goto LAB_001de36a;
      pTVar3 = (Tokenizer *)
               (&this_01->tokenizer->state +
               (ulong)((this_01->tokenizer->type & ~tt_array_open) != tt_name) * 8);
LAB_001ddad7:
      addScalar<QPDF_String,std::__cxx11::string_const&>(this_01,&pTVar3->val);
    }
    else {
      addScalar<QPDF_Operator,std::__cxx11::string_const&>(this_01,&pTVar3->raw_val);
    }
    goto LAB_001dd390;
  case tt_eof:
    local_130 = (undefined1  [8])pp_Var26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"parse error while reading object","");
    qVar14 = InputSource::getLastOffset(this_01->input);
    warn(this_01,qVar14,(string *)local_130);
    _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_04;
    if (local_130 != (undefined1  [8])pp_Var26) {
      operator_delete((void *)local_130,(ulong)(local_128._8_8_ + 1));
      _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_05;
    }
    if ((char)local_c4 == '\0') {
      local_130 = (undefined1  [8])pp_Var26;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"unexpected EOF","");
      qVar14 = InputSource::getLastOffset(this_01->input);
      warn(this_01,qVar14,(string *)local_130);
      goto LAB_001de353;
    }
    local_e8._M_dataplus._M_p._0_4_ = 0;
    local_e8._M_dataplus._M_p._4_4_ = 0;
    local_e8._M_string_length._0_4_ = 0;
    local_e8._M_string_length._4_4_ = 0;
LAB_001de313:
    *(undefined4 *)&local_100->input = local_e8._M_dataplus._M_p._0_4_;
    *(undefined4 *)((long)&local_100->input + 4) = local_e8._M_dataplus._M_p._4_4_;
    *(undefined4 *)&local_100->object_description = (undefined4)local_e8._M_string_length;
    *(undefined4 *)((long)&local_100->object_description + 4) = local_e8._M_string_length._4_4_;
    goto LAB_001de3b3;
  default:
    local_130 = (undefined1  [8])pp_Var26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"treating unknown token type as null while reading object","");
    qVar14 = InputSource::getLastOffset(this_01->input);
    warn(this_01,qVar14,(string *)local_130);
LAB_001ddc29:
    if (local_130 != (undefined1  [8])(local_128 + 8)) {
      operator_delete((void *)local_130,(ulong)(local_128._8_8_ + 1));
    }
switchD_001dd4e6_caseD_0:
    bVar11 = tooManyBadTokens(this_01);
    if (bVar11) goto LAB_001de36a;
switchD_001dd4e6_caseD_b:
    addNull(this_01);
    goto LAB_001dd390;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
  }
  goto LAB_001dd390;
code_r0x001dd3e7:
  this_01->int_count = iVar12 + 1;
  if (1 < iVar12) {
    addInt(this_01,iVar12 + 1);
  }
  qVar14 = InputSource::getLastOffset(this_01->input);
  this_01->last_offset_buffer[this_01->int_count % 2] = qVar14;
  lVar15 = QUtil::string_to_ll((&this_01->tokenizer->val)
                               [(this_01->tokenizer->type & ~tt_array_open) != tt_name]._M_dataplus.
                               _M_p);
  this_01->int_buffer[this_01->int_count % 2] = lVar15;
  goto LAB_001dd390;
switchD_001dd4e6_caseD_2:
  if (499 < (ulong)(((long)(this_01->stack).
                           super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_01->stack).
                           super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3)) {
    local_130 = (undefined1  [8])pp_Var26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"ignoring excessively deeply nested data structure","");
    qVar14 = InputSource::getLastOffset(this_01->input);
    warn(this_01,qVar14,(string *)local_130);
LAB_001de353:
    if (local_130 != (undefined1  [8])pp_Var26) {
      operator_delete((void *)local_130,(ulong)(local_128._8_8_ + 1));
    }
LAB_001de36a:
    psVar21 = (string *)operator_new(0x70);
    psVar21->_M_string_length = 0x100000001;
    (psVar21->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_002eaaf0;
    *(undefined1 *)&psVar21[2]._M_dataplus._M_p = 2;
    psVar21[2]._M_string_length = 0;
    psVar21[2].field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&psVar21[2].field_2 + 8) = 0;
    psVar21[3]._M_dataplus._M_p = (pointer)0x0;
    psVar21[3]._M_string_length = 0xffffffffffffffff;
    local_100->input = (InputSource *)&psVar21->field_2;
    local_100->object_description = psVar21;
    _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100;
LAB_001de3b3:
    QVar31.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var24._M_pi;
    QVar31.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_100;
    return (QPDFObjectHandle)
           QVar31.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_130._0_4_ = (uint)(pTVar3->type == tt_array_open) * 2;
  std::vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>>::
  emplace_back<InputSource&,QPDFParser::parser_state_e>
            (local_c0,this_01->input,(parser_state_e *)local_130);
  this_01->frame =
       (this_01->stack).
       super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>._M_impl.
       super__Vector_impl_data._M_finish + -1;
  goto LAB_001dd388;
}

Assistant:

QPDFObjectHandle
QPDFParser::parseRemainder(bool content_stream)
{
    // This method must take care not to resolve any objects. Don't check the type of any object
    // without first ensuring that it is a direct object. Otherwise, doing so may have the side
    // effect of reading the object and changing the file pointer. If you do this, it will cause a
    // logic error to be thrown from QPDF::inParse().

    bad_count = 0;
    bool b_contents = false;

    while (true) {
        if (!tokenizer.nextToken(input, object_description)) {
            warn(tokenizer.getErrorMessage());
        }
        ++good_count; // optimistically

        if (int_count != 0) {
            // Special handling of indirect references. Treat integer tokens as part of an indirect
            // reference until proven otherwise.
            if (tokenizer.getType() == QPDFTokenizer::tt_integer) {
                if (++int_count > 2) {
                    // Process the oldest buffered integer.
                    addInt(int_count);
                }
                last_offset_buffer[int_count % 2] = input.getLastOffset();
                int_buffer[int_count % 2] = QUtil::string_to_ll(tokenizer.getValue().c_str());
                continue;

            } else if (
                int_count >= 2 && tokenizer.getType() == QPDFTokenizer::tt_word &&
                tokenizer.getValue() == "R") {
                if (context == nullptr) {
                    QTC::TC("qpdf", "QPDFParser indirect without context");
                    throw std::logic_error(
                        "QPDFParser::parse called without context on an object "
                        "with indirect references");
                }
                auto id = QIntC::to_int(int_buffer[(int_count - 1) % 2]);
                auto gen = QIntC::to_int(int_buffer[(int_count) % 2]);
                if (!(id < 1 || gen < 0 || gen >= 65535)) {
                    add(QPDF::ParseGuard::getObject(context, id, gen, parse_pdf));
                } else {
                    QTC::TC("qpdf", "QPDFParser invalid objgen");
                    addNull();
                }
                int_count = 0;
                continue;

            } else if (int_count > 0) {
                // Process the buffered integers before processing the current token.
                if (int_count > 1) {
                    addInt(int_count - 1);
                }
                addInt(int_count);
                int_count = 0;
            }
        }

        switch (tokenizer.getType()) {
        case QPDFTokenizer::tt_eof:
            warn("parse error while reading object");
            if (content_stream) {
                // In content stream mode, leave object uninitialized to indicate EOF
                return {};
            }
            QTC::TC("qpdf", "QPDFParser eof in parseRemainder");
            warn("unexpected EOF");
            return {QPDFObject::create<QPDF_Null>()};

        case QPDFTokenizer::tt_bad:
            QTC::TC("qpdf", "QPDFParser bad token in parseRemainder");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
            continue;

        case QPDFTokenizer::tt_brace_open:
        case QPDFTokenizer::tt_brace_close:
            QTC::TC("qpdf", "QPDFParser bad brace in parseRemainder");
            warn("treating unexpected brace token as null");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
            continue;

        case QPDFTokenizer::tt_array_close:
            if ((bad_count || sanity_checks) && !max_bad_count) {
                // Trigger warning.
                (void)tooManyBadTokens();
                return {QPDFObject::create<QPDF_Null>()};
            }
            if (frame->state == st_array) {
                auto object = frame->null_count > 100
                    ? QPDFObject::create<QPDF_Array>(std::move(frame->olist), true)
                    : QPDFObject::create<QPDF_Array>(std::move(frame->olist));
                setDescription(object, frame->offset - 1);
                // The `offset` points to the next of "[".  Set the rewind offset to point to the
                // beginning of "[". This has been explicitly tested with whitespace surrounding the
                // array start delimiter. getLastOffset points to the array end token and therefore
                // can't be used here.
                if (stack.size() <= 1) {
                    return object;
                }
                stack.pop_back();
                frame = &stack.back();
                add(std::move(object));
            } else {
                QTC::TC("qpdf", "QPDFParser bad array close in parseRemainder");
                warn("treating unexpected array close token as null");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addNull();
            }
            continue;

        case QPDFTokenizer::tt_dict_close:
            if ((bad_count || sanity_checks) && !max_bad_count) {
                // Trigger warning.
                (void)tooManyBadTokens();
                return {QPDFObject::create<QPDF_Null>()};
            }
            if (frame->state <= st_dictionary_value) {
                // Attempt to recover more or less gracefully from invalid dictionaries.
                auto& dict = frame->dict;

                if (frame->state == st_dictionary_value) {
                    QTC::TC("qpdf", "QPDFParser no val for last key");
                    warn(
                        frame->offset,
                        "dictionary ended prematurely; using null as value for last key");
                    dict[frame->key] = QPDFObject::create<QPDF_Null>();
                }

                if (!frame->olist.empty()) {
                    fixMissingKeys();
                }

                if (!frame->contents_string.empty() && dict.count("/Type") &&
                    dict["/Type"].isNameAndEquals("/Sig") && dict.count("/ByteRange") &&
                    dict.count("/Contents") && dict["/Contents"].isString()) {
                    dict["/Contents"] = QPDFObjectHandle::newString(frame->contents_string);
                    dict["/Contents"].setParsedOffset(frame->contents_offset);
                }
                auto object = QPDFObject::create<QPDF_Dictionary>(std::move(dict));
                setDescription(object, frame->offset - 2);
                // The `offset` points to the next of "<<". Set the rewind offset to point to the
                // beginning of "<<". This has been explicitly tested with whitespace surrounding
                // the dictionary start delimiter. getLastOffset points to the dictionary end token
                // and therefore can't be used here.
                if (stack.size() <= 1) {
                    return object;
                }
                stack.pop_back();
                frame = &stack.back();
                add(std::move(object));
            } else {
                QTC::TC("qpdf", "QPDFParser bad dictionary close in parseRemainder");
                warn("unexpected dictionary close token");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addNull();
            }
            continue;

        case QPDFTokenizer::tt_array_open:
        case QPDFTokenizer::tt_dict_open:
            if (stack.size() > 499) {
                QTC::TC("qpdf", "QPDFParser too deep");
                warn("ignoring excessively deeply nested data structure");
                return {QPDFObject::create<QPDF_Null>()};
            } else {
                b_contents = false;
                stack.emplace_back(
                    input,
                    (tokenizer.getType() == QPDFTokenizer::tt_array_open) ? st_array
                                                                          : st_dictionary_key);
                frame = &stack.back();
                continue;
            }

        case QPDFTokenizer::tt_bool:
            addScalar<QPDF_Bool>(tokenizer.getValue() == "true");
            continue;

        case QPDFTokenizer::tt_null:
            addNull();
            continue;

        case QPDFTokenizer::tt_integer:
            if (!content_stream) {
                // Buffer token in case it is part of an indirect reference.
                last_offset_buffer[1] = input.getLastOffset();
                int_buffer[1] = QUtil::string_to_ll(tokenizer.getValue().c_str());
                int_count = 1;
            } else {
                addScalar<QPDF_Integer>(QUtil::string_to_ll(tokenizer.getValue().c_str()));
            }
            continue;

        case QPDFTokenizer::tt_real:
            addScalar<QPDF_Real>(tokenizer.getValue());
            continue;

        case QPDFTokenizer::tt_name:
            if (frame->state == st_dictionary_key) {
                frame->key = tokenizer.getValue();
                frame->state = st_dictionary_value;
                b_contents = decrypter && frame->key == "/Contents";
                continue;
            } else {
                addScalar<QPDF_Name>(tokenizer.getValue());
            }
            continue;

        case QPDFTokenizer::tt_word:
            if (content_stream) {
                addScalar<QPDF_Operator>(tokenizer.getValue());
            } else {
                QTC::TC("qpdf", "QPDFParser treat word as string in parseRemainder");
                warn("unknown token while reading object; treating as string");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addScalar<QPDF_String>(tokenizer.getValue());
            }
            continue;

        case QPDFTokenizer::tt_string:
            {
                auto const& val = tokenizer.getValue();
                if (decrypter) {
                    if (b_contents) {
                        frame->contents_string = val;
                        frame->contents_offset = input.getLastOffset();
                        b_contents = false;
                    }
                    std::string s{val};
                    decrypter->decryptString(s);
                    addScalar<QPDF_String>(s);
                } else {
                    addScalar<QPDF_String>(val);
                }
            }
            continue;

        default:
            warn("treating unknown token type as null while reading object");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
        }
    }
}